

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  uchar uVar3;
  cJSON_bool cVar4;
  uint uVar5;
  cJSON_bool cVar6;
  int iVar7;
  uchar *puVar8;
  size_t sVar9;
  lconv *plVar10;
  ulong uVar11;
  ulong uVar12;
  uchar uVar13;
  cJSON *pcVar14;
  size_t sVar15;
  long lVar16;
  long in_FS_OFFSET;
  double dVar17;
  uchar number_buffer [26];
  double local_50;
  undefined8 local_48;
  undefined2 uStack_40;
  undefined6 local_3e;
  undefined2 uStack_38;
  undefined8 uStack_36;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = 0;
  cVar6 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    bVar2 = (byte)item->type;
    cVar6 = cVar4;
    if (bVar2 < 0x10) {
      switch(bVar2) {
      case 1:
        puVar8 = ensure(output_buffer,6);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"false",6);
LAB_0010428f:
          cVar6 = 1;
        }
        break;
      case 2:
        puVar8 = ensure(output_buffer,5);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"true",5);
          goto LAB_0010428f;
        }
        break;
      case 4:
        puVar8 = ensure(output_buffer,5);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"null",5);
          goto LAB_0010428f;
        }
        break;
      case 8:
        dVar1 = item->valuedouble;
        uStack_38 = 0;
        uStack_36 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_3e = 0;
        plVar10 = localeconv();
        uVar3 = *plVar10->decimal_point;
        local_50 = 0.0;
        if (NAN(dVar1 - dVar1) || NAN(dVar1)) {
          uVar12 = (ulong)local_48 >> 0x20;
          local_48 = CONCAT44((uint)uVar12 & 0xffffff00,0x6c6c756e);
          uVar5 = 4;
LAB_00104204:
          uVar12 = (ulong)uVar5;
          puVar8 = ensure(output_buffer,uVar12 + 1);
          if (puVar8 != (uchar *)0x0) {
            if (uVar12 != 0) {
              uVar11 = 0;
              do {
                uVar13 = *(uchar *)((long)&local_48 + uVar11);
                if (*(uchar *)((long)&local_48 + uVar11) == uVar3) {
                  uVar13 = '.';
                }
                puVar8[uVar11] = uVar13;
                uVar11 = uVar11 + 1;
              } while (uVar12 != uVar11);
            }
            puVar8[uVar12] = '\0';
            output_buffer->offset = output_buffer->offset + uVar12;
            goto LAB_0010428f;
          }
        }
        else {
          if ((dVar1 != (double)item->valueint) || (NAN(dVar1) || NAN((double)item->valueint))) {
            uVar5 = sprintf((char *)&local_48,"%1.15g");
            iVar7 = __isoc99_sscanf(&local_48,"%lg",&local_50);
            if (iVar7 == 1) {
              dVar17 = ABS(local_50);
              if (ABS(local_50) <= ABS(dVar1)) {
                dVar17 = ABS(dVar1);
              }
              if (ABS(local_50 - dVar1) <= dVar17 * 2.220446049250313e-16) goto LAB_001041ff;
            }
            uVar5 = sprintf((char *)&local_48,"%1.17g");
          }
          else {
            uVar5 = sprintf((char *)&local_48,"%d");
          }
LAB_001041ff:
          if (uVar5 < 0x1a) goto LAB_00104204;
        }
LAB_00104246:
        cVar6 = 0;
      }
    }
    else if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          cVar6 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar6;
        }
        goto LAB_001042b1;
      }
      if (bVar2 == 0x20) {
        pcVar14 = item->child;
        puVar8 = ensure(output_buffer,1);
        if (puVar8 != (uchar *)0x0) {
          *puVar8 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          for (; pcVar14 != (cJSON *)0x0; pcVar14 = pcVar14->next) {
            cVar4 = print_value(pcVar14,output_buffer);
            if (cVar4 == 0) goto switchD_00103d90_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            if (pcVar14->next == (cJSON *)0x0) break;
            uVar12 = (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,uVar12 ^ 3);
            if (puVar8 == (uchar *)0x0) goto switchD_00103d90_caseD_3;
            *puVar8 = ',';
            if (output_buffer->format == 0) {
              puVar8 = puVar8 + 1;
            }
            else {
              puVar8[1] = ' ';
              puVar8 = puVar8 + 2;
            }
            *puVar8 = '\0';
            output_buffer->offset = output_buffer->offset + (2 - uVar12);
          }
          puVar8 = ensure(output_buffer,2);
          cVar6 = 0;
          if (puVar8 != (uchar *)0x0) {
            puVar8[0] = ']';
            puVar8[1] = '\0';
            goto LAB_0010428b;
          }
        }
      }
    }
    else if (bVar2 == 0x40) {
      pcVar14 = item->child;
      uVar12 = (ulong)(output_buffer->format == 0);
      puVar8 = ensure(output_buffer,uVar12 ^ 3);
      if (puVar8 != (uchar *)0x0) {
        *puVar8 = '{';
        output_buffer->depth = output_buffer->depth + 1;
        if (output_buffer->format != 0) {
          puVar8[1] = '\n';
        }
        output_buffer->offset = output_buffer->offset + (2 - uVar12);
        if (pcVar14 != (cJSON *)0x0) {
          cVar6 = 0;
          do {
            if (output_buffer->format != 0) {
              puVar8 = ensure(output_buffer,output_buffer->depth);
              if (puVar8 == (uchar *)0x0) goto LAB_00104246;
              if (output_buffer->depth == 0) {
                uVar12 = 0;
              }
              else {
                uVar11 = 0;
                do {
                  puVar8[uVar11] = '\t';
                  uVar11 = uVar11 + 1;
                  uVar12 = output_buffer->depth;
                } while (uVar11 < uVar12);
              }
              output_buffer->offset = output_buffer->offset + uVar12;
            }
            cVar4 = print_string_ptr((uchar *)pcVar14->string,output_buffer);
            if (cVar4 == 0) goto switchD_00103d90_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            sVar15 = 2 - (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,sVar15);
            if (puVar8 == (uchar *)0x0) goto switchD_00103d90_caseD_3;
            *puVar8 = ':';
            if (output_buffer->format != 0) {
              puVar8[1] = '\t';
            }
            output_buffer->offset = output_buffer->offset + sVar15;
            cVar4 = print_value(pcVar14,output_buffer);
            if (cVar4 == 0) goto switchD_00103d90_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            lVar16 = ((ulong)(pcVar14->next != (cJSON *)0x0) + 1) -
                     (ulong)(output_buffer->format == 0);
            puVar8 = ensure(output_buffer,lVar16 + 1);
            if (puVar8 == (uchar *)0x0) goto switchD_00103d90_caseD_3;
            if (pcVar14->next != (cJSON *)0x0) {
              *puVar8 = ',';
              puVar8 = puVar8 + 1;
            }
            if (output_buffer->format != 0) {
              *puVar8 = '\n';
              puVar8 = puVar8 + 1;
            }
            *puVar8 = '\0';
            output_buffer->offset = output_buffer->offset + lVar16;
            pcVar14 = pcVar14->next;
          } while (pcVar14 != (cJSON *)0x0);
        }
        if (output_buffer->format == 0) {
          sVar15 = 2;
        }
        else {
          sVar15 = output_buffer->depth + 1;
        }
        puVar8 = ensure(output_buffer,sVar15);
        cVar6 = 0;
        if (puVar8 != (uchar *)0x0) {
          if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
            uVar12 = 0;
            do {
              puVar8[uVar12] = '\t';
              uVar12 = uVar12 + 1;
            } while (uVar12 < output_buffer->depth - 1);
            puVar8 = puVar8 + uVar12;
          }
          puVar8[0] = '}';
          puVar8[1] = '\0';
LAB_0010428b:
          output_buffer->depth = output_buffer->depth - 1;
          goto LAB_0010428f;
        }
      }
    }
    else if ((bVar2 == 0x80) && (item->valuestring != (char *)0x0)) {
      sVar9 = strlen(item->valuestring);
      puVar8 = ensure(output_buffer,sVar9 + 1);
      if (puVar8 != (uchar *)0x0) {
        memcpy(puVar8,item->valuestring,sVar9 + 1);
        goto LAB_0010428f;
      }
    }
  }
switchD_00103d90_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return cVar6;
  }
LAB_001042b1:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}